

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

Map * new_map(uint size)

{
  uint uVar1;
  Map *pMVar2;
  void **ppvVar3;
  uint local_1c;
  Map *map;
  uint size_local;
  
  pMVar2 = (Map *)malloc(0x18);
  pMVar2->size = 0;
  local_1c = size;
  if (size == 0) {
    local_1c = 0xb;
  }
  pMVar2->capacity = local_1c;
  ppvVar3 = (void **)malloc((ulong)pMVar2->capacity * 0x18);
  pMVar2->elem = ppvVar3;
  uVar1 = get_max_prime(pMVar2->capacity);
  pMVar2->prime = uVar1;
  return pMVar2;
}

Assistant:

Map *new_map(unsigned int size) {
    Map *map = malloc(sizeof(Map));
    map->size = 0;
    map->capacity = size ? size : 11;
    map->elem = malloc(sizeof(List) * map->capacity);
    map->prime = get_max_prime(map->capacity);
    return map;
}